

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O1

bool __thiscall Assimp::Importer::ValidateFlags(Importer *this,uint pFlags)

{
  bool bVar1;
  int iVar2;
  pointer ppBVar3;
  ulong uVar4;
  uint mask;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  
  bVar1 = _ValidateFlags(pFlags);
  if (bVar1) {
    uVar5 = 1;
    uVar7 = 0;
    do {
      if ((pFlags & 0x7ffffbff & uVar5) != 0) {
        ppBVar3 = (this->pimpl->mPostProcessingSteps).
                  super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((this->pimpl->mPostProcessingSteps).
            super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>.
            _M_impl.super__Vector_impl_data._M_finish == ppBVar3) {
          return SUB41(uVar7,0);
        }
        uVar4 = 0;
        uVar6 = 1;
        while (iVar2 = (*ppBVar3[uVar4]->_vptr_BaseProcess[2])(ppBVar3[uVar4],(ulong)uVar5),
              (char)iVar2 == '\0') {
          ppBVar3 = (this->pimpl->mPostProcessingSteps).
                    super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          bVar1 = (ulong)((long)(this->pimpl->mPostProcessingSteps).
                                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar3 >> 3) <=
                  uVar6;
          uVar4 = uVar6;
          uVar6 = (ulong)((int)uVar6 + 1);
          if (bVar1) {
            return SUB41(uVar7,0);
          }
        }
      }
      uVar5 = uVar5 * 2;
      uVar7 = uVar5 >> 0x1f;
      bVar1 = SUB41(uVar5 >> 0x1f,0);
    } while (-1 < (int)uVar5);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Importer::ValidateFlags(unsigned int pFlags) const
{
    ASSIMP_BEGIN_EXCEPTION_REGION();
    // run basic checks for mutually exclusive flags
    if(!_ValidateFlags(pFlags)) {
        return false;
    }

    // ValidateDS does not anymore occur in the pp list, it plays an awesome extra role ...
#ifdef ASSIMP_BUILD_NO_VALIDATEDS_PROCESS
    if (pFlags & aiProcess_ValidateDataStructure) {
        return false;
    }
#endif
    pFlags &= ~aiProcess_ValidateDataStructure;

    // Now iterate through all bits which are set in the flags and check whether we find at least
    // one pp plugin which handles it.
    for (unsigned int mask = 1; mask < (1u << (sizeof(unsigned int)*8-1));mask <<= 1) {

        if (pFlags & mask) {

            bool have = false;
            for( unsigned int a = 0; a < pimpl->mPostProcessingSteps.size(); a++)   {
                if (pimpl->mPostProcessingSteps[a]-> IsActive(mask) ) {

                    have = true;
                    break;
                }
            }
            if (!have) {
                return false;
            }
        }
    }
    ASSIMP_END_EXCEPTION_REGION(bool);
    return true;
}